

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

void __thiscall Polymer::~Polymer(Polymer *this)

{
  this->_vptr_Polymer = (_func_int **)&PTR_Initialize_0019d890;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->uncovered_)._M_t);
  Mask::~Mask(&this->mask_);
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::~IntervalTree(&this->release_sites_);
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::~IntervalTree(&this->binding_sites_);
  std::
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::~vector(&this->release_intervals_);
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~vector(&this->binding_intervals_);
  MobileElementManager::~MobileElementManager(&this->polymerases_);
  std::__cxx11::string::~string((string *)&this->name_);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->wrapper_).super___weak_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::function<void_(std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::_Select1st<std::pair<const_int,_std::function<void_(std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::function<void_(std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::_Select1st<std::pair<const_int,_std::function<void_(std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>_>
               *)&this->termination_signal_);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<Polymer>)._M_weak_this.
              super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

Polymer::~Polymer() {
  // The following code can be uncommented to check that
  // polymers are being properly destroyed during the simulation,
  // i.e. nothing is left uncovered/ no polymerases are bound. 
  // For debugging purposes only. 
  //
  /*std::cout << "Begin destroying polymer." << std::endl;
  if (polymerases_.pol_count() != 0) {
    std::cout << "WARNING: Attempting to destruct Polymer object with "
                 "Polymerases still "
                 "attached. Total propensity of polymer: " +
                     std::to_string(polymerases_.prop_sum())
              << std::endl;
  }
  for (auto const &site : uncovered_) {
    if (site.second != 0) {
      if (site.first == "__rnase_site" || site.first == "__rnase_site_ext") {
        LogCover(site.first);
      } else {
        std::cout << "WARNING: Attempting to destruct Polymer object with "
                     "uncovered binding "
                     "sites. Binding site name: " +
                         site.first
                  << std::endl;
      }
    }
  }*/
}